

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t24(void)

{
  char cVar1;
  undefined8 uVar2;
  int pos;
  char str [12];
  ALLEGRO_USTR_INFO info;
  int local_2c;
  undefined8 local_28;
  undefined4 local_20;
  undefined1 local_18 [16];
  
  local_28 = 0xf4ac82e2bec30061;
  local_20 = 0xbfbf8f;
  uVar2 = al_ref_buffer(local_18,&local_28,0xb);
  local_2c = 0;
  cVar1 = al_ustr_next(uVar2);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 1) {
    log_printf("OK   %s\n","pos == 1");
  }
  else {
    log_printf("FAIL %s\n","pos == 1");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&local_2c);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 2) {
    log_printf("OK   %s\n","pos == 2");
  }
  else {
    log_printf("FAIL %s\n","pos == 2");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&local_2c);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 4) {
    log_printf("OK   %s\n","pos == 4");
  }
  else {
    log_printf("FAIL %s\n","pos == 4");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&local_2c);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 7) {
    log_printf("OK   %s\n","pos == 7");
  }
  else {
    log_printf("FAIL %s\n","pos == 7");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&local_2c);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 0xb) {
    log_printf("OK   %s\n","pos == 11");
  }
  else {
    log_printf("FAIL %s\n","pos == 11");
    error = error + 1;
  }
  cVar1 = al_ustr_next(uVar2,&local_2c);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_next(us, &pos)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_next(us, &pos)");
    error = error + 1;
  }
  if (local_2c == 0xb) {
    log_printf("OK   %s\n","pos == 11");
  }
  else {
    log_printf("FAIL %s\n","pos == 11");
    error = error + 1;
  }
  return;
}

Assistant:

static void t24(void)
{
   const char str[] = "a\0þ€\xf4\x8f\xbf\xbf";
   ALLEGRO_USTR_INFO info;
   const ALLEGRO_USTR *us = al_ref_buffer(&info, str, sizeof(str) - 1);
   int pos = 0;

   CHECK(al_ustr_next(us, &pos));   /* a */
   CHECK(pos == 1);

   CHECK(al_ustr_next(us, &pos));   /* NUL */
   CHECK(pos == 2);

   CHECK(al_ustr_next(us, &pos));   /* þ */
   CHECK(pos == 4);

   CHECK(al_ustr_next(us, &pos));   /* € */
   CHECK(pos == 7);

   CHECK(al_ustr_next(us, &pos));   /* U+10FFFF */
   CHECK(pos == 11);

   CHECK(! al_ustr_next(us, &pos)); /* end */
   CHECK(pos == 11);
}